

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SSC32Interface.cpp
# Opt level: O1

int handlessc32interface(RS232PORT *pSSC32InterfacePseudoRS232Port)

{
  char cVar1;
  int iVar2;
  ssize_t sVar3;
  char *pcVar4;
  double *pdVar5;
  void *__buf;
  bool bVar6;
  double dVar7;
  int pw;
  int chan;
  char recvbuf [512];
  int local_240;
  int local_23c;
  timespec local_238 [32];
  
  local_23c = 0;
  local_240 = 0;
  if (pSSC32InterfacePseudoRS232Port->DevType - 1U < 4) {
    local_238[0].tv_sec = 0;
    iVar2 = ioctl(pSSC32InterfacePseudoRS232Port->s,0x541b,local_238);
    bVar6 = local_238[0].tv_sec == 0;
  }
  else {
    cVar1 = '\x01';
    if (pSSC32InterfacePseudoRS232Port->DevType != 0) goto LAB_0018797a;
    local_238[0].tv_sec = local_238[0].tv_sec & 0xffffffff00000000;
    iVar2 = ioctl(*(int *)&pSSC32InterfacePseudoRS232Port->hDev,0x541b,local_238);
    bVar6 = (int)local_238[0].tv_sec < 1;
  }
  cVar1 = '\x01';
  if (iVar2 == 0) {
    cVar1 = bVar6 * '\x02';
  }
LAB_0018797a:
  if (cVar1 != '\0') {
    local_238[0].tv_sec = 0;
    local_238[0].tv_nsec = 50000000;
    nanosleep(local_238,(timespec *)0x0);
    return 0;
  }
  sVar3 = 0;
  memset(local_238,0,0x200);
  iVar2 = 0;
  while ((iVar2 < 1 || (*(char *)((long)&local_238[0].tv_sec + (ulong)(iVar2 - 1)) != '\r'))) {
    if (0x1ff < iVar2) {
      return 1;
    }
    __buf = (void *)((long)&local_238[0].tv_sec + (long)iVar2);
    if (pSSC32InterfacePseudoRS232Port->DevType - 1U < 4) {
      sVar3 = recv(pSSC32InterfacePseudoRS232Port->s,__buf,1,0);
LAB_00187a1f:
      bVar6 = (int)sVar3 < 1;
    }
    else {
      bVar6 = true;
      if (pSSC32InterfacePseudoRS232Port->DevType == 0) {
        sVar3 = read(*(int *)&pSSC32InterfacePseudoRS232Port->hDev,__buf,1);
        goto LAB_00187a1f;
      }
    }
    if (bVar6) {
      return 1;
    }
    iVar2 = iVar2 + (int)sVar3;
    if ((int)sVar3 == 0) {
      return 1;
    }
  }
  pthread_mutex_lock((pthread_mutex_t *)&StateVariablesCS);
  pcVar4 = strchr((char *)local_238,0x23);
  if (pcVar4 != (char *)0x0) {
    do {
      iVar2 = __isoc99_sscanf(pcVar4,"#%dP%d",&local_23c,&local_240);
      if (iVar2 == 2) {
        if (local_23c == 0) {
          ssc32_u1 = ((double)local_240 + -1500.0) / 500.0;
        }
        if (local_23c == 1) {
          ssc32_u2 = ((double)local_240 + -1500.0) / 500.0;
        }
        if (local_23c == 2) {
          ssc32_u3 = ((double)local_240 + -1500.0) / 500.0;
        }
        if (local_23c == 3) {
          ssc32_u4 = ((double)local_240 + -1500.0) / 500.0;
        }
        if (local_23c == 4) {
          ssc32_u5 = ((double)local_240 + -1500.0) / 500.0;
        }
        if (robid < 0x8000) {
          if (0x1fff < robid) {
            if ((robid != 0x2000) && (robid != 0x4000)) goto LAB_00187cc1;
LAB_00187bad:
            if (local_23c == 2) {
              u = ((double)local_240 + -1500.0) / 500.0;
            }
            if (local_23c != 0) goto LAB_00187c47;
            dVar7 = ((double)local_240 + -1500.0) / 500.0;
            goto LAB_00187c3c;
          }
          if (robid == 0x200) goto LAB_00187c05;
          if (robid == 0x1000) goto LAB_00187bad;
LAB_00187cc1:
          if (local_23c == 0) {
            uw = ((double)local_240 + -1500.0) / 500.0;
          }
          if (local_23c == 1) {
            u = ((double)local_240 + -1500.0) / 500.0;
          }
          if (local_23c == 2) {
            uv = ((double)local_240 + -1500.0) / 500.0;
          }
          if (local_23c != 3) goto LAB_00187c47;
          dVar7 = ((double)local_240 + -1500.0) / 500.0;
          pdVar5 = &ul;
        }
        else {
          if (robid < 0x20000) {
            if (robid == 0x8000) {
              if (local_23c == 0) {
                uw = ((double)local_240 + -1500.0) / 500.0;
              }
              if (local_23c != 1) goto LAB_00187c47;
              dVar7 = ((double)local_240 + -1500.0) / 500.0;
              pdVar5 = &u;
              goto LAB_00187c43;
            }
            if (robid != 0x10000) goto LAB_00187cc1;
          }
          else if (robid != 0x20000) {
            if ((robid == 0x200000) || (robid == 0x100000)) goto LAB_00187bad;
            goto LAB_00187cc1;
          }
LAB_00187c05:
          u = (ssc32_u2 + ssc32_u3) * 0.5;
          dVar7 = (ssc32_u2 - ssc32_u3) * 0.5;
LAB_00187c3c:
          pdVar5 = &uw;
        }
LAB_00187c43:
        *pdVar5 = dVar7;
      }
LAB_00187c47:
    } while (((long)local_238 - (long)pcVar4 < 0x1fe) &&
            (pcVar4 = strchr(pcVar4 + 1,0x23), pcVar4 != (char *)0x0));
  }
  pthread_mutex_unlock((pthread_mutex_t *)&StateVariablesCS);
  return 0;
}

Assistant:

int handlessc32interface(RS232PORT* pSSC32InterfacePseudoRS232Port)
{
	char recvbuf[MAX_NB_BYTES_SSC32];
	int Bytes = 0, BytesReceived = 0, maxrecvbuflen = MAX_NB_BYTES_SSC32, chan = 0, pw = 0;
	char endchar = '\r';
	char* tmp = NULL;

	// Get data...
	if (CheckAvailBytesRS232Port(pSSC32InterfacePseudoRS232Port, NULL) == EXIT_SUCCESS)
	{
		// Prepare the buffers.
		memset(recvbuf, 0, sizeof(recvbuf));

		// Receive byte per byte.
		while ((BytesReceived <= 0)||(recvbuf[BytesReceived-1] != endchar))
		{
			if (BytesReceived >= maxrecvbuflen)
			{
				return EXIT_FAILURE;
			}

			// Receive 1 byte.
			if (ReadRS232Port(pSSC32InterfacePseudoRS232Port, (uint8*)(recvbuf + BytesReceived), 1, &Bytes) == EXIT_SUCCESS)
			{
				if (Bytes == 0)
				{
					return EXIT_FAILURE;
				}
			}
			else
			{
				return EXIT_FAILURE;
			}

			BytesReceived += Bytes;
		}

		// Analyze data.

		EnterCriticalSection(&StateVariablesCS);

		tmp = strstr(recvbuf, "#");
		while (tmp)
		{
			if (sscanf(tmp, "#%dP%d", &chan, &pw) == 2)
			{
				if (chan == 0) ssc32_u1 = (pw-1500.0)/500.0;
				if (chan == 1) ssc32_u2 = (pw-1500.0)/500.0;
				if (chan == 2) ssc32_u3 = (pw-1500.0)/500.0;
				if (chan == 3) ssc32_u4 = (pw-1500.0)/500.0;
				if (chan == 4) ssc32_u5 = (pw-1500.0)/500.0;
				switch (robid)
				{
				case SAILBOAT_SIMULATOR_ROBID:
				case VAIMOS_ROBID:
				case SAILBOAT_ROBID:
				case BUGGY_SIMULATOR_ROBID:
				case BUGGY_ROBID:
					if (chan == 2) u = (pw-1500.0)/500.0;
					if (chan == 0) uw = (pw-1500.0)/500.0;
					break;
				case SAILBOAT2_ROBID:
					if (chan == 0) uw = (pw-1500.0)/500.0;
					if (chan == 1) u = (pw-1500.0)/500.0;
					break;
				case BUBBLE_ROBID:
				case ETAS_WHEEL_ROBID:
				case TANK_SIMULATOR_ROBID:
					// To be compatible with default parameters of SSC320.txt...
					u = (ssc32_u2+ssc32_u3)/2;
					uw = (ssc32_u2-ssc32_u3)/2;
					break;
				case QUADRO_SIMULATOR_ROBID:
				case COPTER_ROBID:
				case ARDUCOPTER_ROBID:
				default:
					if (chan == 0) uw = (pw-1500.0)/500.0;
					if (chan == 1) u = (pw-1500.0)/500.0;
					if (chan == 2) uv = (pw-1500.0)/500.0;
					if (chan == 3) ul = (pw-1500.0)/500.0;
					break;
				}
			}
			if (recvbuf-tmp >= MAX_NB_BYTES_SSC32-2) break;
			tmp = strstr(tmp+1, "#");
		}

		LeaveCriticalSection(&StateVariablesCS);
	}
	else
	{
		uSleep(1000*50);
	}

	return EXIT_SUCCESS;
}